

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O1

void __thiscall stateObservation::LipmDcmEstimator::update(LipmDcmEstimator *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  PointerType ptr;
  double dVar4;
  double in_XMM4_Qa;
  double in_XMM4_Qb;
  double in_XMM7_Qa;
  double in_XMM7_Qb;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  undefined1 local_28 [16];
  
  updateMatricesABQ_(this);
  ZeroDelayObserver::estimateState((ZeroDelayObserver *)&this->filter_);
  if ((0.0 <= (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
              m_storage.m_data.array[0]) ||
     (0.0 <= (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
             m_storage.m_data.array[1])) {
    getBias((LipmDcmEstimator *)local_78);
    dVar2 = (this->previousOrientation_).
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0];
    dVar3 = (this->previousOrientation_).
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1];
    dStack_30 = dVar3 * (double)local_78._8_8_;
    local_38 = dStack_30 + dVar2 * (double)local_78._0_8_;
    dStack_40 = (double)local_78._8_8_ *
                (this->previousOrientation_).
                super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
                [3];
    dVar1 = (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[0];
    dStack_60 = in_XMM7_Qb;
    if (0.0 <= dVar1) {
      in_XMM4_Qb = -0.0;
      in_XMM4_Qa = -dVar1;
      if (-dVar1 <= local_38) {
        in_XMM4_Qa = local_38;
      }
      in_XMM4_Qa = (double)(~-(ulong)(dVar1 < local_38) & (ulong)in_XMM4_Qa);
      in_XMM7_Qa = (double)(-(ulong)(dVar1 < local_38) & (ulong)dVar1 | (ulong)in_XMM4_Qa);
      dStack_60 = in_XMM4_Qb;
    }
    local_48 = (double)local_78._0_8_ *
               (this->previousOrientation_).
               super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
               [2] + dStack_40;
    dVar1 = (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[1];
    if (0.0 <= dVar1) {
      in_XMM4_Qb = -0.0;
      dVar4 = -dVar1;
      if (-dVar1 <= local_48) {
        dVar4 = local_48;
      }
      in_XMM4_Qa = (double)(-(ulong)(dVar1 < local_48) & (ulong)dVar1 |
                           ~-(ulong)(dVar1 < local_48) & (ulong)dVar4);
    }
    local_78._0_8_ =
         in_XMM4_Qa *
         (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
         m_storage.m_data.array[2] + dVar2 * in_XMM7_Qa;
    local_78._8_8_ =
         in_XMM4_Qa *
         (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
         m_storage.m_data.array[3] + dVar3 * in_XMM7_Qa;
    local_68 = in_XMM7_Qa;
    local_58 = in_XMM4_Qa;
    dStack_50 = in_XMM4_Qb;
    setBias(this,(Vector2 *)local_78);
    getUnbiasedDCM((LipmDcmEstimator *)local_28);
    local_78._0_8_ =
         (local_48 - local_58) *
         (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
         m_storage.m_data.array[2] +
         (local_38 - local_68) *
         (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
         m_storage.m_data.array[0] + (double)local_28._0_8_;
    local_78._8_8_ =
         (local_48 - local_58) *
         (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
         m_storage.m_data.array[3] +
         (local_38 - local_68) *
         (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
         m_storage.m_data.array[1] + (double)local_28._8_8_;
    setUnbiasedDCM(this,(Vector2 *)local_78);
  }
  return;
}

Assistant:

void LipmDcmEstimator::update()
{
  updateMatricesABQ_();
  filter_.estimateState();
  if(biasLimit_.x() >= 0 || biasLimit_.y() >= 0)
  {
    Vector2 localBias = getLocalBias();
    Vector2 clampedLocalBias;
    if(biasLimit_.x() >= 0)
    {
      clampedLocalBias.x() = tools::clampScalar(localBias.x(), biasLimit_.x());
    }
    if(biasLimit_.y() >= 0)
    {
      clampedLocalBias.y() = tools::clampScalar(localBias.y(), biasLimit_.y());
    }

    setBias(previousOrientation_ * clampedLocalBias);
    setUnbiasedDCM(getUnbiasedDCM() + previousOrientation_ * (localBias - clampedLocalBias));
  }
}